

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearList.cpp
# Opt level: O3

void createDListR(DLNode **L,int *a,int n)

{
  DLNode *pDVar1;
  ulong uVar2;
  DLNode *pDVar3;
  
  pDVar1 = (DLNode *)malloc(0x18);
  *L = pDVar1;
  pDVar1->prior = (DLNode *)0x0;
  pDVar1->next = (DLNode *)0x0;
  if (0 < n) {
    uVar2 = 0;
    pDVar3 = pDVar1;
    do {
      pDVar1 = (DLNode *)malloc(0x18);
      pDVar1->data = a[uVar2];
      pDVar3->next = pDVar1;
      pDVar1->prior = pDVar3;
      uVar2 = uVar2 + 1;
      pDVar3 = pDVar1;
    } while ((uint)n != uVar2);
  }
  pDVar1->next = (DLNode *)0x0;
  return;
}

Assistant:

void createDListR(DLNode *&L, int a[], int n) { //尾插法建立双链表
    DLNode *s,*r;
    L = (DLNode*)malloc(sizeof(DLNode));
    L->prior = NULL;
    L->next = NULL;
    r = L;  //和单链表一样，r始终指向终端结点，此时头结点即终端结点
    for(int i = 0; i < n; ++i) {
        s = (DLNode*)malloc(sizeof(DLNode));  //创建新结点
        s->data = a[i];
        r->next = s;
        s->prior = r;
        r = s;
    }
    r->next = NULL;
}